

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

double ON_CurveOrientationArea
                 (ON_Curve *curve,ON_Interval *domain,ON_Xform *xform,bool bReverseCurve)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  ON_Curve *local_60;
  double a;
  ON_3dPoint start_point;
  ON_Interval local_domain;
  bool bReverseCurve_local;
  ON_Xform *xform_local;
  ON_Interval *domain_local;
  ON_Curve *curve_local;
  
  if (curve == (ON_Curve *)0x0) {
    curve_local = (ON_Curve *)0x0;
  }
  else {
    (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    if ((domain != (ON_Interval *)0x0) && (bVar1 = ON_Interval::IsIncreasing(domain), bVar1)) {
      ON_Interval::Intersection((ON_Interval *)&start_point.z,domain);
    }
    pdVar3 = ON_Interval::operator[]((ON_Interval *)&start_point.z,0);
    ON_Curve::PointAt((ON_3dPoint *)&a,curve,*pdVar3);
    local_60 = (ON_Curve *)0x0;
    iVar2 = curve_area((ON_3dPoint *)&a,curve,(ON_Interval *)&start_point.z,xform,
                       (double *)&local_60);
    if (iVar2 == 0) {
      local_60 = (ON_Curve *)0x0;
    }
    else if ((bReverseCurve) && (((double)local_60 != 0.0 || (NAN((double)local_60))))) {
      local_60 = (ON_Curve *)((ulong)local_60 ^ 0x8000000000000000);
    }
    curve_local = local_60;
  }
  return (double)curve_local;
}

Assistant:

double ON_CurveOrientationArea( 
  const ON_Curve* curve,
  const ON_Interval* domain,
  const ON_Xform* xform,
  bool bReverseCurve
  )
{
  if ( 0 == curve )
    return 0.0;

  ON_Interval local_domain = curve->Domain();
  if ( 0 != domain && domain->IsIncreasing() )
    local_domain.Intersection(*domain);

  ON_3dPoint start_point = curve->PointAt(local_domain[0]);
  double a = 0.0;
  if ( !curve_area( start_point, curve, local_domain, xform, &a ) ) 
    a = 0.0;
  else if ( bReverseCurve && 0.0 != a )
    a = -a;

  return a;
}